

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O0

int dwarf_get_fde_for_die
              (Dwarf_Debug dbg,Dwarf_Die die,Dwarf_Fde_conflict *ret_fde,Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Cie_conflict local_128;
  Dwarf_Cie_conflict new_cie;
  undefined1 local_118 [4];
  int res2;
  cie_fde_prefix_s prefix_c;
  cie_fde_prefix_s prefix;
  int sdatares;
  int resattr;
  int res;
  int iStack_74;
  Dwarf_Half address_size;
  Dwarf_Unsigned cie_id;
  uchar *cie_ptr;
  uchar *fde_end_ptr;
  uchar *fde_start_ptr;
  uchar *fde_ptr;
  Dwarf_Fde_conflict new_fde;
  Dwarf_Signed signdval;
  Dwarf_Unsigned fde_offset;
  Dwarf_Attribute attr;
  Dwarf_Error *error_local;
  Dwarf_Fde_conflict *ret_fde_local;
  Dwarf_Die die_local;
  Dwarf_Debug dbg_local;
  
  signdval = 0;
  new_fde = (Dwarf_Fde_conflict)0x0;
  fde_ptr = (uchar *)0x0;
  fde_start_ptr = (uchar *)0x0;
  fde_end_ptr = (uchar *)0x0;
  cie_ptr = (uchar *)0x0;
  cie_id = 0;
  _res = (Dwarf_Small *)0x0;
  resattr._2_2_ = 0;
  attr = (Dwarf_Attribute)error;
  error_local = (Dwarf_Error *)ret_fde;
  ret_fde_local = (Dwarf_Fde_conflict *)die;
  die_local = (Dwarf_Die)dbg;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_fde_for_die()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else if (die == (Dwarf_Die)0x0) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x34,
                        "DW_DLE_DIE_NUL: in dwarf_get_fde_for_die(): Called with Dwarf_Die argument null"
                       );
    dbg_local._4_4_ = 1;
  }
  else {
    dbg_local._4_4_ = dwarf_attr(die,0x2001,(Dwarf_Attribute *)&fde_offset,error);
    if (dbg_local._4_4_ == 0) {
      iVar1 = dwarf_formsdata((Dwarf_Attribute)fde_offset,(Dwarf_Signed *)&new_fde,
                              (Dwarf_Error *)attr);
      if (iVar1 == 0) {
        iVar1 = dwarf_get_die_address_size
                          ((Dwarf_Die)ret_fde_local,(Dwarf_Half *)((long)&resattr + 2),
                           (Dwarf_Error *)attr);
        if (iVar1 == 0) {
          dwarf_dealloc_attribute((Dwarf_Attribute)fde_offset);
          dbg_local._4_4_ =
               _dwarf_load_section((Dwarf_Debug)die_local,
                                   (Dwarf_Section_s *)&die_local[0x52].di_is_info,
                                   (Dwarf_Error *)attr);
          if (dbg_local._4_4_ == 0) {
            signdval = (Dwarf_Signed)new_fde;
            fde_end_ptr = *(uchar **)&die_local[0x52].di_is_info;
            fde_start_ptr = fde_end_ptr + (long)new_fde;
            cie_ptr = fde_end_ptr + (long)die_local[0x53].di_debug_ptr;
            iVar1 = _dwarf_validate_register_numbers((Dwarf_Debug)die_local,(Dwarf_Error *)attr);
            if (iVar1 == 1) {
              dbg_local._4_4_ = 1;
            }
            else {
              memset(local_118,0,0x48);
              memset(&prefix_c.cf_section_length,0,0x48);
              dbg_local._4_4_ =
                   _dwarf_read_cie_fde_prefix
                             ((Dwarf_Debug)die_local,fde_start_ptr,
                              *(Dwarf_Small **)&die_local[0x52].di_is_info,
                              (Dwarf_Unsigned)die_local[0x53].di_cu_context,
                              (Dwarf_Unsigned)die_local[0x53].di_debug_ptr,
                              (cie_fde_prefix_s *)&prefix_c.cf_section_length,(Dwarf_Error *)attr);
              if ((dbg_local._4_4_ != 1) && (dbg_local._4_4_ != -1)) {
                _res = (Dwarf_Small *)prefix._24_8_;
                if ((ulong)prefix._24_8_ < die_local[0x53].di_debug_ptr) {
                  dbg_local._4_4_ =
                       _dwarf_create_fde_from_after_start
                                 ((Dwarf_Debug)die_local,
                                  (cie_fde_prefix_s *)&prefix_c.cf_section_length,fde_end_ptr,
                                  (Dwarf_Unsigned)die_local[0x53].di_debug_ptr,prefix.cf_start_addr,
                                  cie_ptr,0,(Dwarf_Cie_conflict)0x0,resattr._2_2_,
                                  (Dwarf_Fde_conflict *)&fde_ptr,(Dwarf_Error *)attr);
                  if ((dbg_local._4_4_ != 1) && (dbg_local._4_4_ != -1)) {
                    fde_ptr[300] = '\x01';
                    fde_ptr[0x12d] = '\0';
                    fde_ptr[0x12e] = '\0';
                    fde_ptr[0x12f] = '\0';
                    if (_res < die_local[0x53].di_debug_ptr) {
                      cie_id = (Dwarf_Unsigned)(_res + *(long *)(fde_ptr + 0x90));
                      if ((cie_id < *(Dwarf_Small **)(fde_ptr + 0x90)) || (cie_id < _res)) {
                        dwarf_dealloc((Dwarf_Debug)die_local,fde_ptr,0x15);
                        fde_ptr = (uchar *)0x0;
                        _dwarf_error_string((Dwarf_Debug)die_local,(Dwarf_Error *)attr,0x96,
                                            "DW_DLE_NO_CIE_FOR_FDE: dwarf_get_fde_for_die fails as the CIE id offset is impossibly large"
                                           );
                        dbg_local._4_4_ = 1;
                      }
                      else {
                        iVar1 = _dwarf_read_cie_fde_prefix
                                          ((Dwarf_Debug)die_local,(Dwarf_Small *)cie_id,
                                           *(Dwarf_Small **)&die_local[0x52].di_is_info,
                                           (Dwarf_Unsigned)die_local[0x53].di_cu_context,
                                           (Dwarf_Unsigned)die_local[0x53].di_debug_ptr,
                                           (cie_fde_prefix_s *)local_118,(Dwarf_Error *)attr);
                        dbg_local._4_4_ = iVar1;
                        if (iVar1 == 1) {
                          dwarf_dealloc((Dwarf_Debug)die_local,fde_ptr,0x15);
                        }
                        else if (iVar1 == -1) {
                          dwarf_dealloc((Dwarf_Debug)die_local,fde_ptr,0x15);
                        }
                        else {
                          cie_id = (Dwarf_Unsigned)prefix_c.cf_start_addr;
                          res = prefix_c.cf_local_length_size;
                          iStack_74 = prefix_c.cf_local_extension_size;
                          if (prefix_c._24_8_ == -1) {
                            new_cie._4_4_ = 0;
                            local_128 = (Dwarf_Cie_conflict)0x0;
                            new_cie._4_4_ =
                                 _dwarf_create_cie_from_after_start
                                           ((Dwarf_Debug)die_local,(cie_fde_prefix_s *)local_118,
                                            fde_end_ptr,prefix_c.cf_start_addr,cie_ptr,0,0,
                                            &local_128,(Dwarf_Error *)attr);
                            if (new_cie._4_4_ == 0) {
                              *(Dwarf_Cie_conflict *)(fde_ptr + 0x18) = local_128;
                              *error_local = (Dwarf_Error)fde_ptr;
                              dbg_local._4_4_ = 0;
                            }
                            else {
                              dwarf_dealloc((Dwarf_Debug)die_local,fde_ptr,0x15);
                            }
                          }
                          else {
                            dwarf_dealloc((Dwarf_Debug)die_local,fde_ptr,0x15);
                            fde_ptr = (uchar *)0x0;
                            _dwarf_error_string((Dwarf_Debug)die_local,(Dwarf_Error *)attr,0x96,
                                                "DW_DLE_NO_CIE_FOR_FDE: The CIE id is not a true cid id. Corrupt DWARF."
                                               );
                            dbg_local._4_4_ = 1;
                          }
                        }
                      }
                    }
                    else {
                      _dwarf_error_string((Dwarf_Debug)die_local,(Dwarf_Error *)attr,0x96,
                                          "DW_DLE_NO_CIE_FOR_FDE: dwarf_get_fde_for_die fails as the CIE id offset is impossibly large"
                                         );
                      dbg_local._4_4_ = 1;
                    }
                  }
                }
                else {
                  _dwarf_error_string((Dwarf_Debug)die_local,(Dwarf_Error *)attr,0x96,
                                      "DW_DLE_NO_CIE_FOR_FDE: dwarf_get_fde_for_die fails as the CIE id offset is impossibly large"
                                     );
                  dbg_local._4_4_ = 1;
                }
              }
            }
          }
        }
        else {
          dwarf_dealloc_attribute((Dwarf_Attribute)fde_offset);
          dbg_local._4_4_ = iVar1;
        }
      }
      else {
        dwarf_dealloc_attribute((Dwarf_Attribute)fde_offset);
        dbg_local._4_4_ = iVar1;
      }
    }
  }
  return dbg_local._4_4_;
}

Assistant:

int
dwarf_get_fde_for_die(Dwarf_Debug dbg,
    Dwarf_Die die,
    Dwarf_Fde * ret_fde, Dwarf_Error * error)
{
    Dwarf_Attribute attr;
    Dwarf_Unsigned fde_offset = 0;
    Dwarf_Signed signdval = 0;
    Dwarf_Fde new_fde = 0;
    unsigned char *fde_ptr = 0;
    unsigned char *fde_start_ptr = 0;
    unsigned char *fde_end_ptr = 0;
    unsigned char *cie_ptr = 0;
    Dwarf_Unsigned cie_id = 0;
    Dwarf_Half     address_size = 0;

    /* Fields for the current Cie being read. */
    int res = 0;
    int resattr = 0;
    int sdatares = 0;

    struct cie_fde_prefix_s prefix;
    struct cie_fde_prefix_s prefix_c;

    CHECK_DBG(dbg,error,"dwarf_get_fde_for_die()");
    if (!die ) {
        _dwarf_error_string(NULL, error, DW_DLE_DIE_NULL,
            "DW_DLE_DIE_NUL: in dwarf_get_fde_for_die(): "
            "Called with Dwarf_Die argument null");
        return DW_DLV_ERROR;
    }
    resattr = dwarf_attr(die, DW_AT_MIPS_fde, &attr, error);
    if (resattr != DW_DLV_OK) {
        return resattr;
    }
    /* why is this formsdata? FIX */
    sdatares = dwarf_formsdata(attr, &signdval, error);
    if (sdatares != DW_DLV_OK) {
        dwarf_dealloc_attribute(attr);
        return sdatares;
    }
    res = dwarf_get_die_address_size(die,&address_size,error);
    if (res != DW_DLV_OK) {
        dwarf_dealloc_attribute(attr);
        return res;
    }
    dwarf_dealloc_attribute(attr);
    res = _dwarf_load_section(dbg, &dbg->de_debug_frame,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    fde_offset = signdval;
    fde_start_ptr = dbg->de_debug_frame.dss_data;
    fde_ptr = fde_start_ptr + fde_offset;
    fde_end_ptr = fde_start_ptr + dbg->de_debug_frame.dss_size;
    res = _dwarf_validate_register_numbers(dbg,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }

    /*  First read in the 'common prefix' to figure out
        what we are to do with this entry. */
    memset(&prefix_c, 0, sizeof(prefix_c));
    memset(&prefix, 0, sizeof(prefix));
    res = _dwarf_read_cie_fde_prefix(dbg, fde_ptr,
        dbg->de_debug_frame.dss_data,
        dbg->de_debug_frame.dss_index,
        dbg->de_debug_frame.dss_size,
        &prefix,
        error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }
    fde_ptr = prefix.cf_addr_after_prefix;
    cie_id = prefix.cf_cie_id;
    if (cie_id  >=  dbg->de_debug_frame.dss_size ) {
        _dwarf_error_string(dbg, error, DW_DLE_NO_CIE_FOR_FDE,
            "DW_DLE_NO_CIE_FOR_FDE: "
            "dwarf_get_fde_for_die fails as the CIE id "
            "offset is impossibly large");
        return DW_DLV_ERROR;
    }
    /*  Pass NULL, not section pointer, for 3rd argument.
        de_debug_frame.dss_data has no eh_frame relevance. */
    res = _dwarf_create_fde_from_after_start(dbg, &prefix,
        fde_start_ptr,
        dbg->de_debug_frame.dss_size,
        fde_ptr,
        fde_end_ptr,
        /* use_gnu_cie_calc= */ 0,
        /* Dwarf_Cie = */ 0,
        address_size,
        &new_fde, error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }
    /* DW_DLV_OK */

    /*  This is the only situation this is set.
        and is really dangerous. as fde and cie
        are set for dealloc by dwarf_finish(). */
    new_fde->fd_fde_owns_cie = TRUE;
    /*  Now read the cie corresponding to the fde,
        _dwarf_read_cie_fde_prefix checks
        cie_ptr for being within the section. */
    if (cie_id  >=  dbg->de_debug_frame.dss_size ) {
        _dwarf_error_string(dbg, error, DW_DLE_NO_CIE_FOR_FDE,
            "DW_DLE_NO_CIE_FOR_FDE: "
            "dwarf_get_fde_for_die fails as the CIE id "
            "offset is impossibly large");
        return DW_DLV_ERROR;
    }
    cie_ptr = new_fde->fd_section_ptr + cie_id;
    if ((Dwarf_Unsigned)(uintptr_t)cie_ptr  <
        (Dwarf_Unsigned)(uintptr_t)new_fde->fd_section_ptr ||
        (Dwarf_Unsigned)(uintptr_t)cie_ptr <  cie_id) {
        dwarf_dealloc(dbg,new_fde,DW_DLA_FDE);
        new_fde = 0;
        _dwarf_error_string(dbg, error, DW_DLE_NO_CIE_FOR_FDE,
            "DW_DLE_NO_CIE_FOR_FDE: "
            "dwarf_get_fde_for_die fails as the CIE id "
            "offset is impossibly large");
        return DW_DLV_ERROR;
    }
    res = _dwarf_read_cie_fde_prefix(dbg, cie_ptr,
        dbg->de_debug_frame.dss_data,
        dbg->de_debug_frame.dss_index,
        dbg->de_debug_frame.dss_size,
        &prefix_c, error);
    if (res == DW_DLV_ERROR) {
        dwarf_dealloc(dbg,new_fde,DW_DLA_FDE);
        new_fde = 0;
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        dwarf_dealloc(dbg,new_fde,DW_DLA_FDE);
        new_fde = 0;
        return res;
    }

    cie_ptr = prefix_c.cf_addr_after_prefix;
    cie_id = prefix_c.cf_cie_id;

    if (cie_id == (Dwarf_Unsigned)DW_CIE_ID) {
        int res2 = 0;
        Dwarf_Cie new_cie = 0;

        /*  Pass NULL, not section pointer, for 3rd argument.
            de_debug_frame.dss_data has no eh_frame relevance. */
        res2 = _dwarf_create_cie_from_after_start(dbg,
            &prefix_c,
            fde_start_ptr,
            cie_ptr,
            fde_end_ptr,
            /* cie_count= */ 0,
            /* use_gnu_cie_calc= */
            0, &new_cie, error);
        if (res2 != DW_DLV_OK) {
            dwarf_dealloc(dbg, new_fde, DW_DLA_FDE);
            return res;
        }
        new_fde->fd_cie = new_cie;
    } else {
        dwarf_dealloc(dbg,new_fde,DW_DLA_FDE);
        new_fde = 0;
        _dwarf_error_string(dbg, error, DW_DLE_NO_CIE_FOR_FDE,
            "DW_DLE_NO_CIE_FOR_FDE: "
            "The CIE id is not a true cid id. Corrupt DWARF.");
        return DW_DLV_ERROR;
    }
    *ret_fde = new_fde;
    return DW_DLV_OK;
}